

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl_sv.c
# Opt level: O0

char * dtl_sv_to_cstr(dtl_sv_t *self,_Bool *ok)

{
  dtl_sv_type_id dVar1;
  adt_str_t *paVar2;
  char *pcVar3;
  _Bool *ok_local;
  dtl_sv_t *self_local;
  
  if (self != (dtl_sv_t *)0x0) {
    if (ok != (_Bool *)0x0) {
      *ok = false;
    }
    dVar1 = dtl_sv_type(self);
    switch(dVar1) {
    case DTL_SV_NONE:
      break;
    case DTL_SV_I32:
    case DTL_SV_U32:
    case DTL_SV_I64:
    case DTL_SV_U64:
    case DTL_SV_FLT:
    case DTL_SV_DBL:
    case DTL_SV_CHAR:
      if (self->pAny->tmpStr == (adt_str_t *)0x0) {
        paVar2 = (adt_str_t *)adt_str_new();
        self->pAny->tmpStr = paVar2;
      }
      else {
        adt_str_clear(self->pAny->tmpStr);
      }
      if (self->pAny->tmpStr != (adt_str_t *)0x0) {
        dtl_sv_to_string_internal(self,self->pAny->tmpStr,ok);
        pcVar3 = (char *)adt_str_cstr(self->pAny->tmpStr);
        return pcVar3;
      }
      break;
    case DTL_SV_BOOL:
      if (ok != (_Bool *)0x0) {
        *ok = true;
      }
      if (((self->pAny->val).cr & 1U) == 0) {
        return "false";
      }
      return "true";
    case DTL_SV_STR:
      if (ok != (_Bool *)0x0) {
        *ok = true;
      }
      pcVar3 = (char *)adt_str_cstr((self->pAny->val).i64);
      return pcVar3;
    case DTL_SV_PTR:
      break;
    case DTL_SV_DV:
      break;
    case DTL_SV_BYTES:
      break;
    case DTL_SV_BYTEARRAY:
    }
  }
  return (char *)0x0;
}

Assistant:

const char* dtl_sv_to_cstr(dtl_sv_t *self, bool* ok){
   if(self != NULL)
   {
      if (ok != NULL) *ok = false;
      switch(dtl_sv_type(self)){
      case DTL_SV_NONE:
         break;
      case DTL_SV_I32:
      case DTL_SV_U32:
      case DTL_SV_I64:
      case DTL_SV_U64:
      case DTL_SV_FLT:
      case DTL_SV_DBL:
      case DTL_SV_CHAR:
         if (self->pAny->tmpStr == NULL)
         {
            self->pAny->tmpStr = adt_str_new();
         }
         else
         {
            adt_str_clear(self->pAny->tmpStr);
         }
         if (self->pAny->tmpStr != 0)
         {
            dtl_sv_to_string_internal(self, self->pAny->tmpStr, ok);
            return adt_str_cstr(self->pAny->tmpStr);
         }
         break;
      case DTL_SV_BOOL:
         if (ok != NULL) *ok = true;
         return self->pAny->val.bl? "true" : "false";
      case DTL_SV_STR:
         if (ok != NULL) *ok = true;
         return adt_str_cstr(self->pAny->val.str);
      case DTL_SV_PTR:
         break;
      case DTL_SV_DV:
         break;
      case DTL_SV_BYTES:
         break;
      case DTL_SV_BYTEARRAY:
         break;
      }
   }
   return NULL;
}